

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

bool __thiscall
llvm::cl::opt<int,_false,_llvm::cl::parser<int>_>::handleOccurrence
          (opt<int,_false,_llvm::cl::parser<int>_> *this,uint pos,StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  int local_40;
  uint local_3c;
  parser_data_type_conflict Val;
  uint pos_local;
  opt<int,_false,_llvm::cl::parser<int>_> *this_local;
  StringRef Arg_local;
  StringRef ArgName_local;
  
  Arg_local.Data = (char *)Arg.Length;
  this_local = (opt<int,_false,_llvm::cl::parser<int>_> *)Arg.Data;
  Arg_local.Length = (size_t)ArgName.Data;
  local_40 = 0;
  local_3c = pos;
  _Val = this;
  bVar1 = parser<int>::parse(&this->Parser,&this->super_Option,ArgName,Arg,&local_40);
  if (!bVar1) {
    opt_storage<int,_false,_false>::setValue<int>
              (&this->super_opt_storage<int,_false,_false>,&local_40,false);
    Option::setPosition(&this->super_Option,local_3c);
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }